

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.h
# Opt level: O0

void __thiscall
kway_min_id_heap<int,_4,_std::less<int>_>::kway_min_id_heap(void *param_1,int param_2)

{
  size_type __n;
  vector<bool,_std::allocator<bool>_> *this;
  allocator_type *__a;
  allocator_type *in_stack_ffffffffffffff88;
  allocator_type *in_stack_ffffffffffffff90;
  bool *__value;
  size_type in_stack_ffffffffffffff98;
  vector<kway_min_id_heap<int,_4,_std::less<int>_>::id_key_pair,_std::allocator<kway_min_id_heap<int,_4,_std::less<int>_>::id_key_pair>_>
  *in_stack_ffffffffffffffa0;
  bool local_2b [3];
  undefined4 local_28;
  int local_14;
  void *local_10;
  
  *(undefined4 *)param_1 = 0;
  local_14 = param_2;
  local_10 = param_1;
  std::allocator<kway_min_id_heap<int,_4,_std::less<int>_>::id_key_pair>::allocator
            ((allocator<kway_min_id_heap<int,_4,_std::less<int>_>::id_key_pair> *)0x15c6c2);
  std::
  vector<kway_min_id_heap<int,_4,_std::less<int>_>::id_key_pair,_std::allocator<kway_min_id_heap<int,_4,_std::less<int>_>::id_key_pair>_>
  ::vector(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::allocator<kway_min_id_heap<int,_4,_std::less<int>_>::id_key_pair>::~allocator
            ((allocator<kway_min_id_heap<int,_4,_std::less<int>_>::id_key_pair> *)0x15c6e2);
  __n = (long)param_1 + 0x20;
  this = (vector<bool,_std::allocator<bool>_> *)(long)local_14;
  local_28 = 0xffffffff;
  std::allocator<int>::allocator((allocator<int> *)0x15c711);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)this,__n,
             (value_type_conflict *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::allocator<int>::~allocator((allocator<int> *)0x15c736);
  __a = (allocator_type *)(long)local_14;
  local_2b[1] = false;
  __value = local_2b;
  std::allocator<bool>::allocator((allocator<bool> *)0x15c762);
  std::vector<bool,_std::allocator<bool>_>::vector(this,__n,__value,__a);
  std::allocator<bool>::~allocator((allocator<bool> *)0x15c787);
  check_id_invariants((kway_min_id_heap<int,_4,_std::less<int>_> *)param_1);
  check_order_invariants((kway_min_id_heap<int,_4,_std::less<int>_> *)param_1);
  return;
}

Assistant:

explicit kway_min_id_heap(int id_count,
        key_order_type order = key_order_type())
        : heap_end(0)
        , heap(id_count)
        , id_pos(id_count, -1)
        , order(std::move(order))
        , contained_flags(id_count, false)
    {
        check_id_invariants();
        check_order_invariants();
    }